

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::Descriptor::GetLocationPath
          (Descriptor *this,vector<int,_std::allocator<int>_> *output)

{
  int *piVar1;
  Descriptor *pDVar2;
  Descriptor **ppDVar3;
  iterator iVar4;
  int local_14;
  
  if (this->containing_type_ == (Descriptor *)0x0) {
    iVar4._M_current =
         (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    piVar1 = (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
    if (iVar4._M_current == piVar1) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(output,iVar4,&local_14);
      pDVar2 = this->containing_type_;
      iVar4._M_current =
           (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      piVar1 = (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = 4;
      iVar4._M_current = iVar4._M_current + 1;
      (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar4._M_current;
      pDVar2 = (Descriptor *)0x0;
    }
    ppDVar3 = &this->file_->message_types_;
    if (pDVar2 != (Descriptor *)0x0) {
      ppDVar3 = &pDVar2->nested_types_;
    }
    pDVar2 = *ppDVar3;
  }
  else {
    GetLocationPath(this->containing_type_,output);
    iVar4._M_current =
         (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    piVar1 = (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
    if (iVar4._M_current == piVar1) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(output,iVar4,&local_14);
      iVar4._M_current =
           (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      piVar1 = (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = 3;
      iVar4._M_current = iVar4._M_current + 1;
      (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar4._M_current;
    }
    ppDVar3 = &this->file_->message_types_;
    if (this->containing_type_ != (Descriptor *)0x0) {
      ppDVar3 = &this->containing_type_->nested_types_;
    }
    pDVar2 = *ppDVar3;
  }
  if (iVar4._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(output,iVar4,&local_14);
  }
  else {
    *iVar4._M_current = (int)((ulong)((long)this - (long)pDVar2) >> 5) * -0x33333333;
    (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar4._M_current + 1;
  }
  return;
}

Assistant:

void Descriptor::GetLocationPath(std::vector<int>* output) const {
  if (containing_type()) {
    containing_type()->GetLocationPath(output);
    output->push_back(DescriptorProto::kNestedTypeFieldNumber);
    output->push_back(index());
  } else {
    output->push_back(FileDescriptorProto::kMessageTypeFieldNumber);
    output->push_back(index());
  }
}